

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O3

int __thiscall soplex::IdxSet::dim(IdxSet *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (0 < (long)this->num) {
    iVar3 = -1;
    lVar2 = 0;
    do {
      iVar1 = this->idx[lVar2];
      if (this->idx[lVar2] < iVar3) {
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      lVar2 = lVar2 + 1;
    } while (this->num != lVar2);
    return iVar3;
  }
  return -1;
}

Assistant:

int IdxSet::dim() const
{
   int ddim = -1;

   for(int i = 0; i < size(); i++)
      if(ddim < idx[i])
         ddim = idx[i];

   return ddim;
}